

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O1

void commit_bonesfile(char *bonesid)

{
  __uid_t _Var1;
  int iVar2;
  char *__new;
  char *__old;
  char tempbuf [64];
  char acStack_58 [72];
  
  sprintf(bones,"bon%s",bonesid);
  __new = fqname(bones,0,0);
  _Var1 = getuid();
  sprintf(acStack_58,"%d%s.bn",(ulong)_Var1,plname);
  __old = fqname(acStack_58,0,1);
  iVar2 = rename(__old,__new);
  if ((iVar2 != 0) && (flags.debug != '\0')) {
    pline("couldn\'t rename %s to %s.",__old,__new);
  }
  return;
}

Assistant:

void commit_bonesfile(char *bonesid)
{
	const char *fq_bones, *tempname;
	char tempbuf[PL_NSIZ+32];
	int ret;

	sprintf(bones, "bon%s", bonesid);
	fq_bones = fqname(bones, BONESPREFIX, 0);
	sprintf(tempbuf, "%d%s.bn", (int)getuid(), plname);
	tempname = fqname(tempbuf, BONESPREFIX, 1);

	ret = rename(tempname, fq_bones);
	if (wizard && ret != 0)
		pline("couldn't rename %s to %s.", tempname, fq_bones);
}